

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool Is11SectorTrack(Track *track)

{
  bool bVar1;
  int iVar2;
  reference this;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  Track *track_local;
  
  iVar2 = Track::size(track);
  if (iVar2 == 0xb) {
    __end1 = Track::begin(track);
    s = (Sector *)Track::end(track);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                       *)&s), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator*(&__end1);
      if ((((this->datarate != _250K) || (this->encoding != MFM)) ||
          (iVar2 = Sector::size(this), iVar2 != 0x200)) ||
         (bVar1 = Sector::has_good_data(this), !bVar1)) {
        return false;
      }
      __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
      operator++(&__end1);
    }
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [32])"detected 11-sector tight track\n");
    }
    track_local._7_1_ = true;
  }
  else {
    track_local._7_1_ = false;
  }
  return track_local._7_1_;
}

Assistant:

bool Is11SectorTrack(const Track& track)
{
    if (track.size() != 11)
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.size() != 512 || !s.has_good_data())
        {
            return false;
        }
    }

    if (opt.debug) util::cout << "detected 11-sector tight track\n";
    return true;
}